

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O1

partSizeData *
initScanLine(partSizeData *__return_storage_ptr__,
            vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *pixelData,FrameBuffer *buf,InputPart *in,Header *outHeader)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  uint64_t uVar7;
  Header *h;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  Compression *pCVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint64_t uVar14;
  Slice local_68 [56];
  
  Imf_3_4::InputPart::header();
  piVar5 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar5;
  iVar2 = piVar5[1];
  uVar11 = (ulong)((piVar5[2] - iVar1) + 1);
  uVar6 = (ulong)((piVar5[3] - iVar2) + 1);
  uVar7 = uVar6 * uVar11;
  h = (Header *)Imf_3_4::InputPart::header();
  iVar3 = channelCount(h);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(pixelData,(long)iVar3);
  Imf_3_4::Header::channels();
  p_Var8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  Imf_3_4::Header::channels();
  p_Var9 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
  if (p_Var8 == p_Var9) {
    uVar14 = 0;
  }
  else {
    lVar12 = 0;
    uVar14 = 0;
    do {
      iVar4 = Imf_3_4::pixelTypeSize(p_Var8[9]._M_color);
      uVar13 = (ulong)iVar4;
      uVar14 = uVar14 + (uVar11 / (ulong)(long)*(int *)&p_Var8[9].field_0x4) * uVar13 *
                        (uVar6 / (ulong)(long)*(int *)&p_Var8[9]._M_parent);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 ((long)&(((pixelData->
                           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data + lVar12),uVar7 * uVar13);
      Imf_3_4::Slice::Slice
                (local_68,p_Var8[9]._M_color,
                 (char *)(*(long *)((long)&(((pixelData->
                                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                           super__Vector_impl_data + lVar12) -
                         ((long)iVar2 * uVar11 + (long)iVar1) * uVar13),uVar13,uVar13 * uVar11,
                 *(int *)&p_Var8[9].field_0x4,*(int *)&p_Var8[9]._M_parent,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)buf,(Slice *)(p_Var8 + 1));
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      Imf_3_4::Header::channels();
      p_Var9 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      lVar12 = lVar12 + 0x18;
    } while (p_Var8 != p_Var9);
  }
  __return_storage_ptr__->rawSize = 0;
  __return_storage_ptr__->pixelCount = 0;
  __return_storage_ptr__->channelCount = 0;
  __return_storage_ptr__->tileCount = 0;
  __return_storage_ptr__->isDeep = false;
  __return_storage_ptr__->isTiled = false;
  __return_storage_ptr__->compression = NUM_COMPRESSION_METHODS;
  (__return_storage_ptr__->partType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->partType).field_2;
  (__return_storage_ptr__->partType)._M_string_length = 0;
  (__return_storage_ptr__->partType).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->rawSize = uVar14;
  __return_storage_ptr__->pixelCount = uVar7;
  Imf_3_4::InputPart::header();
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->partType);
  Imf_3_4::InputPart::header();
  pCVar10 = (Compression *)Imf_3_4::Header::compression();
  __return_storage_ptr__->compression = *pCVar10;
  __return_storage_ptr__->channelCount = (long)iVar3;
  return __return_storage_ptr__;
}

Assistant:

partSizeData
initScanLine (
    vector<vector<char>>& pixelData,
    FrameBuffer&          buf,
    InputPart&            in,
    const Header&         outHeader)
{
    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());

    pixelData.resize (numChans);
    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    int    channelNumber = 0;
    size_t rawSize       = 0;

    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        int    samplesize      = pixelTypeSize (i.channel ().type);
        size_t pixelsInChannel = (width / i.channel ().xSampling) *
                                 (height / i.channel ().ySampling);
        rawSize += pixelsInChannel * samplesize;
        pixelData[channelNumber].resize (numPixels * samplesize);

        buf.insert (
            i.name (),
            Slice (
                i.channel ().type,
                pixelData[channelNumber].data () - offsetToOrigin * samplesize,
                samplesize,
                samplesize * width,
                i.channel ().xSampling,
                i.channel ().ySampling));
        ++channelNumber;
    }

    partSizeData data;
    data.rawSize      = rawSize;
    data.pixelCount   = width * height;
    data.partType     = in.header ().type ();
    data.compression  = in.header ().compression ();
    data.channelCount = numChans;
    return data;
}